

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O3

void __thiscall llvm::DWARFDebugMacro::dump(DWARFDebugMacro *this,raw_ostream *OS)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  raw_ostream *prVar5;
  size_t sVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  StringRef SVar11;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  WithColor local_60;
  uint *local_50;
  pointer local_48;
  pointer local_40;
  int local_34;
  
  local_48 = (this->MacroLists).
             super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->MacroLists).
             super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48 != local_40) {
    iVar8 = 0;
    do {
      uVar4 = (ulong)(local_48->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                     super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                     super_SmallVectorBase.Size;
      if (uVar4 != 0) {
        puVar10 = (uint *)(local_48->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                          super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                          super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                          super_SmallVectorBase.BeginX;
        local_50 = puVar10 + uVar4 * 6;
        do {
          local_34 = 0;
          iVar3 = local_34;
          if (iVar8 != 0) {
            iVar8 = iVar8 - (uint)(*puVar10 == 4);
            for (iVar9 = iVar8; iVar9 != 0; iVar9 = iVar9 + -1) {
              SVar11.Length = 2;
              SVar11.Data = "  ";
              raw_ostream::operator<<(OS,SVar11);
              iVar3 = iVar8;
            }
          }
          local_34 = iVar3;
          uVar1 = *puVar10;
          WithColor::WithColor(&local_60,OS,Macro,false);
          prVar5 = local_60.OS;
          SVar11 = dwarf::MacinfoString(*puVar10);
          raw_ostream::operator<<(prVar5,SVar11);
          WithColor::~WithColor(&local_60);
          uVar2 = *puVar10;
          if (uVar2 - 1 < 2) {
            Str_00.Length = 0xb;
            Str_00.Data = " - lineno: ";
            prVar5 = raw_ostream::operator<<(OS,Str_00);
            raw_ostream::operator<<(prVar5,*(unsigned_long *)(puVar10 + 2));
            sVar6 = 8;
            pcVar7 = " macro: ";
LAB_00d6ad24:
            Str_01.Length = sVar6;
            Str_01.Data = pcVar7;
            prVar5 = raw_ostream::operator<<(OS,Str_01);
            raw_ostream::operator<<(prVar5,*(char **)(puVar10 + 4));
          }
          else if (uVar2 == 3) {
            Str_02.Length = 0xb;
            Str_02.Data = " - lineno: ";
            prVar5 = raw_ostream::operator<<(OS,Str_02);
            raw_ostream::operator<<(prVar5,*(unsigned_long *)(puVar10 + 2));
            Str_03.Length = 10;
            Str_03.Data = " filenum: ";
            prVar5 = raw_ostream::operator<<(OS,Str_03);
            raw_ostream::operator<<(prVar5,*(unsigned_long *)(puVar10 + 4));
          }
          else if (uVar2 == 0xff) {
            Str.Length = 0xd;
            Str.Data = " - constant: ";
            prVar5 = raw_ostream::operator<<(OS,Str);
            raw_ostream::operator<<(prVar5,*(unsigned_long *)(puVar10 + 2));
            sVar6 = 9;
            pcVar7 = " string: ";
            goto LAB_00d6ad24;
          }
          iVar8 = local_34 + (uint)(uVar1 == 3);
          Str_04.Length = 1;
          Str_04.Data = "\n";
          raw_ostream::operator<<(OS,Str_04);
          puVar10 = puVar10 + 6;
        } while (puVar10 != local_50);
      }
      Str_05.Length = 1;
      Str_05.Data = "\n";
      raw_ostream::operator<<(OS,Str_05);
      local_48 = local_48 + 1;
    } while (local_48 != local_40);
  }
  return;
}

Assistant:

void DWARFDebugMacro::dump(raw_ostream &OS) const {
  unsigned IndLevel = 0;
  for (const auto &Macros : MacroLists) {
    for (const Entry &E : Macros) {
      // There should not be DW_MACINFO_end_file when IndLevel is Zero. However,
      // this check handles the case of corrupted ".debug_macinfo" section.
      if (IndLevel > 0)
        IndLevel -= (E.Type == DW_MACINFO_end_file);
      // Print indentation.
      for (unsigned I = 0; I < IndLevel; I++)
        OS << "  ";
      IndLevel += (E.Type == DW_MACINFO_start_file);

      WithColor(OS, HighlightColor::Macro).get() << MacinfoString(E.Type);
      switch (E.Type) {
      default:
        // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
        break;
      case DW_MACINFO_define:
      case DW_MACINFO_undef:
        OS << " - lineno: " << E.Line;
        OS << " macro: " << E.MacroStr;
        break;
      case DW_MACINFO_start_file:
        OS << " - lineno: " << E.Line;
        OS << " filenum: " << E.File;
        break;
      case DW_MACINFO_end_file:
        break;
      case DW_MACINFO_vendor_ext:
        OS << " - constant: " << E.ExtConstant;
        OS << " string: " << E.ExtStr;
        break;
      }
      OS << "\n";
    }
    OS << "\n";
  }
}